

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

void __thiscall JSONNode::merge(JSONNode *this,uint num,...)

{
  internalJSONNode *piVar1;
  char in_AL;
  void **ppvVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  json_string local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  piVar1 = this->internal;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_f8.field_2._M_allocated_capacity = (size_type)local_d8;
  local_f8._M_string_length = (size_type)&args[0].overflow_arg_area;
  local_f8._M_dataplus._M_p = (pointer)0x3000000010;
  if (num != 0) {
    do {
      uVar3 = (ulong)local_f8._M_dataplus._M_p & 0xffffffff;
      if (uVar3 < 0x29) {
        local_f8._M_dataplus._M_p._0_4_ = (int)local_f8._M_dataplus._M_p + 8;
        ppvVar2 = (void **)(uVar3 + local_f8.field_2._M_allocated_capacity);
      }
      else {
        ppvVar2 = (void **)local_f8._M_string_length;
        local_f8._M_string_length = (size_type)(local_f8._M_string_length + 8);
      }
      merge(this,(JSONNode *)*ppvVar2);
      num = num - 1;
    } while (num != 0);
  }
  return;
}

Assistant:

void JSONNode::merge(unsigned int, ...) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   va_list args;
	   va_start(args, num);
	   for(unsigned int i = 0; i < num; ++i){
		  merge(va_arg(args, JSONNode*));
	   }
	   va_end(args);
    #endif
}